

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::PrintValue<QString,void>(QString *container,ostream *os)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  QChar *elem;
  char16_t *obj_bytes;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  lVar2 = (container->d).size;
  if (lVar2 != 0) {
    obj_bytes = (container->d).ptr;
    lVar2 = lVar2 * 2;
    lVar3 = 0;
    do {
      lVar2 = lVar2 + -2;
      if (lVar3 == 0) {
LAB_0010f23e:
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
        PrintBytesInObjectTo((uchar *)obj_bytes,2,os);
        lVar3 = lVar3 + 1;
        bVar1 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1);
        if (lVar3 != 0x20) goto LAB_0010f23e;
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar3 = 0x20;
        bVar1 = true;
      }
    } while ((!bVar1) && (obj_bytes = obj_bytes + 1, lVar2 != 0));
    if (lVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }